

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vcgen_smooth_poly1.cpp
# Opt level: O2

void __thiscall
agg::vcgen_smooth_poly1::calculate
          (vcgen_smooth_poly1 *this,vertex_dist *v0,vertex_dist *v1,vertex_dist *v2,vertex_dist *v3)

{
  double dVar1;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar2;
  
  dVar11 = v1->dist;
  dVar10 = v0->dist / (v0->dist + dVar11);
  dVar11 = dVar11 / (v2->dist + dVar11);
  dVar3 = v0->y;
  dVar4 = v2->x;
  dVar5 = v2->y;
  dVar6 = v1->x;
  dVar7 = v1->y;
  dVar1 = this->m_smooth_value;
  dVar2 = this->m_smooth_value;
  dVar8 = v3->x;
  dVar9 = v3->y;
  this->m_ctrl1_x = (dVar4 - (dVar10 * (dVar4 - v0->x) + v0->x)) * dVar1 + dVar6;
  this->m_ctrl1_y = (dVar5 - (dVar10 * (dVar5 - dVar3) + dVar3)) * dVar2 + dVar7;
  this->m_ctrl2_x = (dVar6 - (dVar11 * (dVar8 - dVar6) + dVar6)) * dVar1 + dVar4;
  this->m_ctrl2_y = (dVar7 - (dVar11 * (dVar9 - dVar7) + dVar7)) * dVar2 + dVar5;
  return;
}

Assistant:

void vcgen_smooth_poly1::calculate(const vertex_dist& v0, 
                                       const vertex_dist& v1, 
                                       const vertex_dist& v2,
                                       const vertex_dist& v3)
    {

        double k1 = v0.dist / (v0.dist + v1.dist);
        double k2 = v1.dist / (v1.dist + v2.dist);

        double xm1 = v0.x + (v2.x - v0.x) * k1;
        double ym1 = v0.y + (v2.y - v0.y) * k1;
        double xm2 = v1.x + (v3.x - v1.x) * k2;
        double ym2 = v1.y + (v3.y - v1.y) * k2;

        m_ctrl1_x = v1.x + m_smooth_value * (v2.x - xm1);
        m_ctrl1_y = v1.y + m_smooth_value * (v2.y - ym1);
        m_ctrl2_x = v2.x + m_smooth_value * (v1.x - xm2);
        m_ctrl2_y = v2.y + m_smooth_value * (v1.y - ym2);
    }